

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

bool __thiscall wabt::interp::Store::HasValueType(Store *this,Ref ref,ValueType type)

{
  Object *this_00;
  bool bVar1;
  Enum EVar2;
  ObjectKind OVar3;
  Object **ppOVar4;
  bool local_5d;
  Object *obj;
  Store *this_local;
  ValueType type_local;
  Ref ref_local;
  
  this_local = (Store *)type;
  type_local = (ValueType)ref.index;
  bVar1 = IsValid(this,ref);
  if (bVar1) {
    bVar1 = wabt::operator==((Type)this_local,ExternRef);
    if (bVar1) {
      ref_local.index._7_1_ = true;
    }
    else {
      bVar1 = interp::operator==((Ref)type_local,Ref::Null);
      if (bVar1) {
        ref_local.index._7_1_ = true;
      }
      else {
        ppOVar4 = FreeList<wabt::interp::Object_*>::Get(&this->objects_,(Index)type_local);
        this_00 = *ppOVar4;
        EVar2 = Type::operator_cast_to_Enum((Type *)&this_local);
        if (EVar2 == ExnRef) {
          OVar3 = Object::kind(this_00);
          ref_local.index._7_1_ = OVar3 == Exception;
        }
        else if (EVar2 == FuncRef) {
          OVar3 = Object::kind(this_00);
          local_5d = true;
          if (OVar3 != DefinedFunc) {
            OVar3 = Object::kind(this_00);
            local_5d = OVar3 == HostFunc;
          }
          ref_local.index._7_1_ = local_5d;
        }
        else {
          ref_local.index._7_1_ = false;
        }
      }
    }
  }
  else {
    ref_local.index._7_1_ = false;
  }
  return ref_local.index._7_1_;
}

Assistant:

bool Store::HasValueType(Ref ref, ValueType type) const {
  // TODO opt?
  if (!IsValid(ref)) {
    return false;
  }
  if (type == ValueType::ExternRef) {
    return true;
  }
  if (ref == Ref::Null) {
    return true;
  }

  Object* obj = objects_.Get(ref.index);
  switch (type) {
    case ValueType::FuncRef:
      return obj->kind() == ObjectKind::DefinedFunc ||
             obj->kind() == ObjectKind::HostFunc;
    case ValueType::ExnRef:
      return obj->kind() == ObjectKind::Exception;
    default:
      return false;
  }
}